

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.h
# Opt level: O0

void __thiscall Imf_3_3::ChannelList::ChannelList(ChannelList *this,ChannelList *param_2)

{
  map<Imf_3_3::Name,_Imf_3_3::Channel,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Channel>_>_>
  *in_RSI;
  map<Imf_3_3::Name,_Imf_3_3::Channel,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Channel>_>_>
  *in_stack_ffffffffffffffe8;
  
  std::
  map<Imf_3_3::Name,_Imf_3_3::Channel,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Channel>_>_>
  ::map(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

class IMF_EXPORT_TYPE ChannelList
{
public:
    //--------------
    // Add a channel
    //--------------

    IMF_EXPORT
    void insert (const char name[], const Channel& channel);

    IMF_EXPORT
    void insert (const std::string& name, const Channel& channel);

    //------------------------------------------------------------------
    // Access to existing channels:
    //
    // [n]		Returns a reference to the channel with name n.
    //			If no channel with name n exists, an IEX_NAMESPACE::ArgExc
    //			is thrown.
    //
    // findChannel(n)	Returns a pointer to the channel with name n,
    //			or 0 if no channel with name n exists.
    //
    //------------------------------------------------------------------

    IMF_EXPORT
    Channel& operator[] (const char name[]);
    IMF_EXPORT
    const Channel& operator[] (const char name[]) const;

    IMF_EXPORT
    Channel& operator[] (const std::string& name);
    IMF_EXPORT
    const Channel& operator[] (const std::string& name) const;

    IMF_EXPORT
    Channel* findChannel (const char name[]);
    IMF_EXPORT
    const Channel* findChannel (const char name[]) const;

    IMF_EXPORT
    Channel* findChannel (const std::string& name);
    IMF_EXPORT
    const Channel* findChannel (const std::string& name) const;

    //-------------------------------------------
    // Iterator-style access to existing channels
    //-------------------------------------------

    typedef std::map<Name, Channel> ChannelMap;

    class Iterator;
    class ConstIterator;

    IMF_EXPORT
    Iterator begin ();
    IMF_EXPORT
    ConstIterator begin () const;

    IMF_EXPORT
    Iterator end ();
    IMF_EXPORT
    ConstIterator end () const;

    IMF_EXPORT
    Iterator find (const char name[]);
    IMF_EXPORT
    ConstIterator find (const char name[]) const;

    IMF_EXPORT
    Iterator find (const std::string& name);
    IMF_EXPORT
    ConstIterator find (const std::string& name) const;

    //-----------------------------------------------------------------
    // Support for image layers:
    //
    // In an image file with many channels it is sometimes useful to
    // group the channels into "layers", that is, into sets of channels
    // that logically belong together.  Grouping channels into layers
    // is done using a naming convention:  channel C in layer L is
    // called "L.C".
    //
    // For example, a computer graphic image may contain separate
    // R, G and B channels for light that originated at each of
    // several different virtual light sources.  The channels in
    // this image might be called "light1.R", "light1.G", "light1.B",
    // "light2.R", "light2.G", "light2.B", etc.
    //
    // Note that this naming convention allows layers to be nested;
    // for example, "light1.specular.R" identifies the "R" channel
    // in the "specular" sub-layer of layer "light1".
    //
    // Channel names that don't contain a "." or that contain a
    // "." only at the beginning or at the end are not considered
    // to be part of any layer.
    //
    // layers(lns)		sorts the channels in this ChannelList
    //				into layers and stores the names of
    //				all layers, sorted alphabetically,
    //				into string set lns.
    //
    // channelsInLayer(ln,f,l)	stores a pair of iterators in f and l
    // 				such that the loop
    //
    // 				for (ConstIterator i = f; i != l; ++i)
    // 				   ...
    //
    //				iterates over all channels in layer ln.
    //				channelsInLayer (ln, l, p) calls
    //				channelsWithPrefix (ln + ".", l, p).
    //
    //-----------------------------------------------------------------

    IMF_EXPORT
    void layers (std::set<std::string>& layerNames) const;

    IMF_EXPORT
    void channelsInLayer (
        const std::string& layerName, Iterator& first, Iterator& last);

    IMF_EXPORT
    void channelsInLayer (
        const std::string& layerName,
        ConstIterator&     first,
        ConstIterator&     last) const;

    //-------------------------------------------------------------------
    // Find all channels whose name begins with a given prefix:
    //
    // channelsWithPrefix(p,f,l) stores a pair of iterators in f and l
    // such that the following loop iterates over all channels whose name
    // begins with string p:
    //
    //		for (ConstIterator i = f; i != l; ++i)
    //		    ...
    //
    //-------------------------------------------------------------------

    IMF_EXPORT
    void
    channelsWithPrefix (const char prefix[], Iterator& first, Iterator& last);

    IMF_EXPORT
    void channelsWithPrefix (
        const char prefix[], ConstIterator& first, ConstIterator& last) const;

    IMF_EXPORT
    void channelsWithPrefix (
        const std::string& prefix, Iterator& first, Iterator& last);

    IMF_EXPORT
    void channelsWithPrefix (
        const std::string& prefix,
        ConstIterator&     first,
        ConstIterator&     last) const;

    //------------
    // Operator ==
    //------------

    IMF_EXPORT
    bool operator== (const ChannelList& other) const;

private:
    ChannelMap _map;
}